

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

string_view __thiscall
google::protobuf::FieldDescriptor::PrintableNameForExtension(FieldDescriptor *this)

{
  byte bVar1;
  Descriptor *pDVar2;
  Descriptor *pDVar3;
  DescriptorNames *pDVar4;
  string_view sVar5;
  
  bVar1 = this->field_0x1;
  if (((((bVar1 & 8) != 0) &&
       ((this->containing_type_->options_->field_0)._impl_.message_set_wire_format_ == true)) &&
      (this->type_ == '\v')) && ((this->merged_features_->field_0)._impl_.field_presence_ != 3)) {
    if (0xbf < bVar1 != (bool)((bVar1 & 0x20) >> 5)) {
      PrintableNameForExtension();
    }
    if ((bVar1 & 0x20) == 0) {
      pDVar3 = (Descriptor *)(this->scope_).containing_oneof;
      pDVar2 = message_type(this);
      if (pDVar3 == pDVar2) {
        pDVar3 = message_type(this);
        pDVar4 = &pDVar3->all_names_;
        goto LAB_0022935f;
      }
    }
  }
  pDVar4 = &this->all_names_;
LAB_0022935f:
  sVar5._M_len = (ulong)*(ushort *)(pDVar4->payload_ + 2);
  sVar5._M_str = pDVar4->payload_ + ~sVar5._M_len;
  return sVar5;
}

Assistant:

absl::string_view FieldDescriptor::PrintableNameForExtension() const {
  const bool is_message_set_extension =
      is_extension() &&
      containing_type()->options().message_set_wire_format() &&
      type() == FieldDescriptor::TYPE_MESSAGE && !is_required() &&
      !is_repeated() && extension_scope() == message_type();
  return is_message_set_extension ? message_type()->full_name() : full_name();
}